

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O1

Sfm_Ntk_t * Gia_ManExtractMfs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  word wVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  char *pcVar13;
  char *pcVar14;
  word *pwVar15;
  int *piVar16;
  Vec_Wrd_t *pVVar17;
  long lVar18;
  long lVar19;
  void *pvVar20;
  Sfm_Ntk_t *pSVar21;
  Vec_Int_t *pVVar22;
  long lVar23;
  uint uVar24;
  size_t __n;
  Tim_Man_t *pTVar25;
  Vec_Str_t *vEmpty;
  ulong uVar26;
  ulong uVar27;
  char *__assertion;
  uint uVar28;
  long lVar29;
  int iVar30;
  size_t __size;
  Vec_Wec_t *vFanins;
  int local_140;
  int nBbIns;
  ulong local_128;
  Vec_Wrd_t *local_120;
  int nBbOuts;
  long local_110;
  Vec_Int_t *local_108;
  Vec_Wrd_t *local_100;
  ulong local_f8;
  int local_ec;
  ulong local_e8;
  Vec_Str_t *local_e0;
  Vec_Wec_t *local_d8;
  Vec_Str_t *local_d0;
  int local_c8;
  uint local_c4;
  word uTruth;
  Tim_Man_t *local_b8;
  Vec_Int_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  int local_84;
  size_t local_80;
  word uTruths6 [6];
  
  uTruths6[0] = 0xaaaaaaaaaaaaaaaa;
  uTruths6[1] = 0xcccccccccccccccc;
  uTruths6[2] = 0xf0f0f0f0f0f0f0f0;
  uTruths6[3] = 0xff00ff00ff00ff00;
  uTruths6[4] = 0xffff0000ffff0000;
  uTruths6[5] = 0xffffffff00000000;
  pTVar25 = (Tim_Man_t *)p->pManTime;
  local_c8 = Gia_ManBoxNum(p);
  if (local_c8 == 0) {
    iVar6 = p->vCis->nSize - p->nRegs;
  }
  else {
    iVar6 = Tim_ManPiNum(pTVar25);
  }
  if (local_c8 == 0) {
    local_ec = p->vCos->nSize - p->nRegs;
  }
  else {
    local_ec = Tim_ManPoNum(pTVar25);
  }
  nBbIns = 0;
  nBbOuts = 0;
  iVar7 = Gia_ManLutSizeMax(p);
  iVar11 = 6;
  if (6 < iVar7) {
    iVar11 = iVar7;
  }
  if (0xf < iVar7) {
    __assert_fail("nLutSizeMax < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x4a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  local_108 = (Vec_Int_t *)CONCAT44(local_108._4_4_,iVar7);
  if (pTVar25 != (Tim_Man_t *)0x0) {
    Tim_ManBlackBoxIoNum(pTVar25,&nBbIns,&nBbOuts);
  }
  uVar9 = nBbOuts;
  iVar7 = p->vCis->nSize;
  local_b8 = pTVar25;
  iVar8 = Gia_ManLutNum(p);
  uVar28 = iVar8 + iVar7;
  uVar24 = p->vCos->nSize;
  local_98 = (ulong)uVar24;
  local_90 = (ulong)(uint)nBbIns;
  iVar7 = uVar24 + nBbIns + uVar28;
  local_a0 = (ulong)(uint)nBbOuts;
  iVar8 = nBbOuts + iVar7 + 1;
  uVar24 = iVar7 + nBbOuts;
  local_d8 = (Vec_Wec_t *)malloc(0x10);
  local_128 = CONCAT44(local_128._4_4_,iVar8);
  iVar7 = 8;
  if (6 < uVar24) {
    iVar7 = iVar8;
  }
  local_d8->nSize = 0;
  local_d8->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar12 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar12 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  local_d8->pArray = pVVar12;
  iVar7 = (int)local_128;
  local_d8->nSize = (int)local_128;
  local_d0 = (Vec_Str_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < uVar24) {
    iVar8 = iVar7;
  }
  local_d0->nSize = 0;
  local_d0->nCap = iVar8;
  __size = (size_t)iVar8;
  if (iVar8 == 0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pcVar13 = (char *)malloc(__size);
  }
  local_d0->pArray = pcVar13;
  local_d0->nSize = (int)local_128;
  __n = (size_t)(int)local_128;
  pcVar14 = (char *)0x0;
  memset(pcVar13,0,__n);
  local_e0 = (Vec_Str_t *)malloc(0x10);
  local_e0->nSize = 0;
  local_e0->nCap = iVar8;
  local_e8 = (ulong)uVar28;
  if (iVar8 != 0) {
    pcVar14 = (char *)malloc(__size);
  }
  local_e0->pArray = pcVar14;
  local_e0->nSize = (int)local_128;
  pwVar15 = (word *)0x0;
  memset(pcVar14,0,__n);
  local_120 = (Vec_Wrd_t *)malloc(0x10);
  local_120->nSize = 0;
  local_120->nCap = iVar8;
  if (iVar8 != 0) {
    pwVar15 = (word *)malloc(__size * 8);
  }
  local_120->pArray = pwVar15;
  local_120->nSize = (int)local_128;
  piVar16 = (int *)0x0;
  memset(pwVar15,0,__n * 8);
  local_b0 = (Vec_Int_t *)malloc(0x10);
  local_b0->nSize = 0;
  local_b0->nCap = iVar8;
  if (iVar8 != 0) {
    piVar16 = (int *)malloc(__size << 2);
  }
  local_b0->pArray = piVar16;
  local_b0->nSize = (int)local_128;
  if (piVar16 != (int *)0x0) {
    memset(piVar16,0,__n << 2);
  }
  pVVar17 = (Vec_Wrd_t *)malloc(0x10);
  pVVar17->nCap = 10000;
  pVVar17->nSize = 0;
  pwVar15 = (word *)malloc(80000);
  vEmpty = local_e0;
  pVVar17->pArray = pwVar15;
  uVar24 = p->nObjs;
  if ((p->vCopies).nCap < (int)uVar24) {
    piVar16 = (p->vCopies).pArray;
    if (piVar16 == (int *)0x0) {
      piVar16 = (int *)malloc((long)(int)uVar24 << 2);
    }
    else {
      piVar16 = (int *)realloc(piVar16,(long)(int)uVar24 << 2);
    }
    (p->vCopies).pArray = piVar16;
    if (piVar16 == (int *)0x0) {
LAB_00772f94:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar24;
  }
  if (0 < (int)uVar24) {
    memset((p->vCopies).pArray,0xff,(ulong)uVar24 * 4);
  }
  pTVar25 = local_b8;
  (p->vCopies).nSize = uVar24;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    piVar16 = pVVar12->pArray;
    lVar18 = 0;
    do {
      iVar7 = piVar16[lVar18];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00772eda;
      if (iVar7 == 0) break;
      if ((p->vCopies).nSize <= iVar7) goto LAB_0077302f;
      (p->vCopies).pArray[iVar7] = (int)lVar18 + uVar9;
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar12->nSize);
    uVar9 = (int)lVar18 + uVar9;
  }
  if (((int)uVar9 < 0) || (local_d0->nSize <= (int)uVar9)) {
LAB_00772f37:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
  }
  local_d0->pArray[uVar9] = '\x01';
  if (local_120->nSize <= (int)uVar9) {
LAB_00772f75:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
  }
  local_120->pArray[uVar9] = 0;
  if ((p->vCopies).nSize < 1) {
LAB_0077302f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(p->vCopies).pArray = uVar9;
  uVar27 = (ulong)(uVar9 + 1);
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  uVar26 = 0x10;
  if (0x10 < (int)local_108) {
    uVar26 = (ulong)local_108 & 0xffffffff;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = (int)uVar26;
  piVar16 = (int *)malloc(uVar26 << 2);
  pVVar12->pArray = piVar16;
  local_108 = pVVar12;
  Gia_ObjComputeTruthTableStart(p,iVar11);
  local_100 = pVVar17;
  if (1 < p->nObjs) {
    lVar18 = 1;
    do {
      pVVar12 = p->vMapping;
      if (pVVar12->nSize <= lVar18) goto LAB_00772ebb;
      piVar16 = pVVar12->pArray;
      if (piVar16[lVar18] != 0) {
        local_108->nSize = 0;
        iVar11 = (int)uVar27;
        if ((iVar11 < 0) || (local_d8->nSize <= iVar11)) goto LAB_00772f18;
        if (pVVar12->nSize <= lVar18) goto LAB_00772ebb;
        iVar7 = piVar16[lVar18];
        if (((long)iVar7 < 0) || (pVVar12->nSize <= iVar7)) goto LAB_00772ebb;
        pVVar12 = local_d8->pArray + uVar27;
        iVar7 = piVar16[iVar7];
        if (pVVar12->nCap < iVar7) {
          if (pVVar12->pArray == (int *)0x0) {
            piVar16 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar16 = (int *)realloc(pVVar12->pArray,(long)iVar7 << 2);
          }
          pVVar12->pArray = piVar16;
          if (piVar16 == (int *)0x0) goto LAB_00772f94;
          pVVar12->nCap = iVar7;
        }
        pVVar22 = p->vMapping;
        lVar19 = (long)pVVar22->nSize;
        if (lVar19 <= lVar18) goto LAB_00772ebb;
        lVar29 = 0;
        while( true ) {
          pVVar17 = local_100;
          pVVar4 = local_108;
          piVar16 = pVVar22->pArray;
          lVar23 = (long)piVar16[lVar18];
          if ((lVar23 < 0) || ((int)lVar19 <= piVar16[lVar18])) goto LAB_00772ebb;
          if (piVar16[lVar23] <= lVar29) break;
          iVar7 = piVar16[lVar23 + lVar29 + 1];
          if (((long)iVar7 < 0) || ((p->vCopies).nSize <= iVar7)) goto LAB_00772ebb;
          iVar8 = (p->vCopies).pArray[iVar7];
          if (iVar8 < 0) {
            __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                          ,0x69,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
          }
          Vec_IntPush(pVVar12,iVar8);
          Vec_IntPush(local_108,iVar7);
          lVar29 = lVar29 + 1;
          pVVar22 = p->vMapping;
          lVar19 = (long)pVVar22->nSize;
          if (lVar19 <= lVar18) goto LAB_00772ebb;
        }
        if (0xf < local_108->nSize) {
          __assert_fail("Vec_IntSize(vLeaves) < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x6d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if (local_108->nSize != piVar16[lVar23]) {
          __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x6e,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if (p->nObjs <= lVar18) goto LAB_00772eda;
        pwVar15 = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar18,local_108);
        iVar7 = Abc_TtMinBase(pwVar15,pVVar12->pArray,pVVar12->nSize,pVVar4->nSize);
        if (pVVar12->nSize < iVar7) {
LAB_00773010:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar12->nSize = iVar7;
        if (iVar7 < 7) {
          if (local_120->nSize <= iVar11) goto LAB_00772f75;
          local_120->pArray[uVar27] = *pwVar15;
        }
        else {
          uVar24 = 1 << ((byte)(iVar7 + -6) & 0x1f);
          if (local_b0->nSize <= iVar11) goto LAB_0077302f;
          local_b0->pArray[uVar27] = pVVar17->nSize;
          if (iVar7 + -6 != 0x1f) {
            if ((int)uVar24 < 2) {
              uVar24 = 1;
            }
            uVar26 = 0;
            do {
              Vec_WrdPush(pVVar17,pwVar15[uVar26]);
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
        }
        iVar7 = p->vMapping->nSize;
        if (iVar7 <= lVar18) goto LAB_00772ebb;
        piVar16 = p->vMapping->pArray;
        iVar8 = piVar16[lVar18];
        if (((long)iVar8 < 0) || (iVar7 <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar16 = piVar16 + iVar8;
        if (piVar16[(long)*piVar16 + 1] < 0) {
          if ((local_d0->nSize <= iVar11) ||
             (local_d0->pArray[uVar27] = '\x01', local_e0->nSize <= iVar11)) goto LAB_00772f37;
          local_e0->pArray[uVar27] = '\x01';
        }
        if ((p->vCopies).nSize <= lVar18) goto LAB_0077302f;
        (p->vCopies).pArray[lVar18] = iVar11;
        uVar27 = (ulong)(iVar11 + 1);
        pTVar25 = local_b8;
        vEmpty = local_e0;
        pVVar17 = local_100;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < p->nObjs);
  }
  Gia_ObjComputeTruthTableStop(p);
  wVar5 = uTruths6[0];
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar29 = uVar27 << 4;
    local_a8 = uVar27 * 8;
    lVar19 = 0;
    lVar18 = (long)local_ec;
    pVVar17 = local_120;
    uVar26 = uVar27;
    local_110 = lVar18;
    local_f8 = uVar27;
    do {
      iVar11 = pVVar12->pArray[lVar19];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_00772eda:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar11;
      uVar24 = iVar11 - (*(uint *)pGVar1 & 0x1fffffff);
      if (((int)uVar24 < 0) || ((p->vCopies).nSize <= (int)uVar24)) {
LAB_00772ebb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = (p->vCopies).pArray[uVar24];
      if (iVar11 < 0) {
        __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                      ,0x89,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
      }
      local_140 = (int)uVar27;
      if ((local_140 < 0) || (iVar7 = (int)lVar19, local_d8->nSize <= (int)uVar26 + iVar7))
      goto LAB_00772f18;
      pVVar12 = local_d8->pArray;
      if (*(int *)((long)&pVVar12->nCap + lVar29) < 1) {
        pvVar20 = *(void **)((long)&pVVar12->pArray + lVar29);
        if (pvVar20 == (void *)0x0) {
          pvVar20 = malloc(4);
        }
        else {
          pvVar20 = realloc(pvVar20,4);
        }
        *(void **)((long)&pVVar12->pArray + lVar29) = pvVar20;
        if (pvVar20 == (void *)0x0) goto LAB_00772f94;
        *(undefined4 *)((long)&pVVar12->nCap + lVar29) = 1;
        pVVar17 = local_120;
        uVar26 = local_f8;
        lVar18 = local_110;
      }
      **(int **)((long)&pVVar12->pArray + lVar29) = iVar11;
      *(undefined4 *)((long)&pVVar12->nSize + lVar29) = 1;
      iVar11 = (int)uVar26;
      if (lVar19 < p->vCos->nSize - lVar18) {
        if ((local_d0->nSize <= iVar11 + iVar7) ||
           (local_d0->pArray[lVar19 + uVar26] = '\x01', local_e0->nSize <= iVar11 + iVar7))
        goto LAB_00772f37;
        local_e0->pArray[lVar19 + uVar26] = '\x01';
        uTruth = (long)((int)(*(uint *)pGVar1 << 2) >> 0x1f) ^ wVar5;
        if (pVVar17->nSize <= iVar11 + iVar7) goto LAB_00772f75;
        *(word *)((long)pVVar17->pArray + lVar19 * 8 + local_a8) = uTruth;
      }
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
LAB_00772ff1:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar24 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      if (((int)uVar24 < 0) || ((p->vCopies).nSize <= (int)uVar24)) goto LAB_0077302f;
      (p->vCopies).pArray[uVar24 & 0x7fffffff] = iVar11 + iVar7;
      lVar19 = lVar19 + 1;
      pVVar12 = p->vCos;
      lVar29 = lVar29 + 0x10;
      pTVar25 = local_b8;
    } while (lVar19 < pVVar12->nSize);
    uVar27 = uVar26 + lVar19;
    vEmpty = local_e0;
    pVVar17 = local_100;
  }
  vFanins = local_d8;
  if ((int)uVar27 + nBbIns != (int)local_128) {
    __assert_fail("Counter == nMfsVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x97,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  pGVar3 = p->pAigExtra;
  if (pGVar3 != (Gia_Man_t *)0x0) {
    iVar11 = pGVar3->vCis->nSize;
    if (0xf < iVar11) {
      __assertion = "Gia_ManCiNum(p->pAigExtra) < 16";
      pcVar14 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c";
      pcVar13 = "Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)";
      goto LAB_00772f2d;
    }
    Gia_ObjComputeTruthTableStart(pGVar3,iVar11);
    wVar5 = uTruths6[0];
    if (local_c8 < 1) {
      local_140 = 0;
      local_110 = CONCAT44(local_110._4_4_,iVar6);
      local_128 = 0;
      iVar11 = 0;
    }
    else {
      iVar7 = (int)local_e8 + (int)local_98 + (int)local_90;
      iVar8 = (int)local_a0;
      iVar11 = 0;
      local_128 = 0;
      local_140 = 0;
      local_110 = CONCAT44(local_110._4_4_,iVar6);
      iVar30 = 0;
      do {
        iVar10 = Tim_ManBoxInputNum(pTVar25,iVar30);
        local_e8 = CONCAT44(local_e8._4_4_,iVar10);
        local_c4 = Tim_ManBoxOutputNum(pTVar25,iVar30);
        local_84 = iVar30;
        iVar30 = Tim_ManBoxIsBlack(pTVar25,iVar30);
        local_f8 = local_e8 & 0xffffffff;
        if (iVar30 == 0) {
          local_108->nSize = 0;
          if (0 < (int)local_e8) {
            uVar26 = 0;
            do {
              pVVar12 = p->pAigExtra->vCis;
              if ((long)pVVar12->nSize <= (long)uVar26) goto LAB_00772ebb;
              iVar30 = pVVar12->pArray[uVar26];
              if ((iVar30 < 0) || (p->pAigExtra->nObjs <= iVar30)) goto LAB_00772eda;
              Vec_IntPush(local_108,iVar30);
              uVar26 = uVar26 + 1;
            } while (local_f8 != uVar26);
          }
          if (0 < (int)local_c4) {
            local_80 = (long)(int)local_e8 << 2;
            local_98 = CONCAT44(local_98._4_4_,(int)local_110 - iVar6);
            local_90 = (long)(int)local_110;
            local_a0 = (ulong)local_c4;
            uVar26 = 0;
            do {
              pVVar12 = local_108;
              if ((int)local_110 < 0) goto LAB_00772ebb;
              if ((long)p->vCis->nSize <= (long)(local_90 + uVar26)) goto LAB_00772ebb;
              iVar30 = p->vCis->pArray[local_90 + uVar26];
              if (((long)iVar30 < 0) || (p->nObjs <= iVar30)) goto LAB_00772eda;
              iVar10 = (int)local_e8;
              if ((p->vCopies).nSize <= iVar30) goto LAB_00772ebb;
              iVar30 = (p->vCopies).pArray[iVar30];
              lVar18 = (long)iVar30;
              if ((lVar18 < 0) || (vFanins->nSize <= iVar30)) goto LAB_00772f18;
              local_a8 = uVar26;
              pVVar22 = vFanins->pArray + lVar18;
              if (vFanins->pArray[lVar18].nCap < (int)local_e8) {
                if (pVVar22->pArray == (int *)0x0) {
                  piVar16 = (int *)malloc(local_80);
                }
                else {
                  piVar16 = (int *)realloc(pVVar22->pArray,local_80);
                }
                pVVar22->pArray = piVar16;
                if (piVar16 == (int *)0x0) goto LAB_00772f94;
                pVVar22->nCap = iVar10;
              }
              uVar26 = local_f8;
              lVar19 = (long)local_140;
              if (0 < iVar10) {
                do {
                  if ((local_140 < 0) || (p->vCos->nSize <= lVar19)) goto LAB_00772ebb;
                  iVar10 = p->vCos->pArray[lVar19];
                  if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00772eda;
                  if ((p->vCopies).nSize <= iVar10) goto LAB_00772ebb;
                  iVar10 = (p->vCopies).pArray[iVar10];
                  if (iVar10 < 0) {
                    __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                                  ,0xb6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
                  }
                  Vec_IntPush(pVVar22,iVar10);
                  uVar26 = uVar26 - 1;
                  lVar19 = lVar19 + 1;
                } while (uVar26 != 0);
              }
              if (local_d0->nSize <= iVar30) goto LAB_00772f37;
              local_d0->pArray[lVar18] = '\x01';
              uVar24 = (int)local_98 + (int)local_a8;
              if ((int)uVar24 < 0) goto LAB_00772ebb;
              pGVar3 = p->pAigExtra;
              if (pGVar3->vCos->nSize <= (int)uVar24) goto LAB_00772ebb;
              uVar24 = pGVar3->vCos->pArray[uVar24];
              if (((long)(int)uVar24 < 0) || (pGVar3->nObjs <= (int)uVar24)) goto LAB_00772eda;
              pGVar1 = pGVar3->pObjs + (int)uVar24;
              if (uVar24 == ((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) {
                uTruth = (word)((*(int *)pGVar1 << 2) >> 0x1f);
LAB_00772ca5:
                pwVar15 = &uTruth;
              }
              else {
                uVar26 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
                if (((uint)*(undefined8 *)(pGVar1 + -uVar26) & 0x9fffffff) == 0x9fffffff) {
                  uTruth = (long)((*(int *)pGVar1 << 2) >> 0x1f) ^
                           *(ulong *)((long)uTruths6 +
                                     (ulong)(uint)((int)((ulong)*(undefined8 *)(pGVar1 + -uVar26) >>
                                                        0x20) << 3));
                  goto LAB_00772ca5;
                }
                pwVar15 = Gia_ObjComputeTruthTableCut(pGVar3,pGVar1 + -uVar26,pVVar12);
                if ((pGVar1->field_0x3 & 0x20) != 0) {
                  uVar24 = 1 << ((char)pVVar12->nSize - 6U & 0x1f);
                  if (pVVar12->nSize < 7) {
                    uVar24 = 1;
                  }
                  if (0 < (int)uVar24) {
                    uVar26 = 0;
                    do {
                      pwVar15[uVar26] = ~pwVar15[uVar26];
                      uVar26 = uVar26 + 1;
                    } while (uVar24 != uVar26);
                  }
                }
              }
              pVVar17 = local_100;
              iVar10 = Abc_TtMinBase(pwVar15,pVVar22->pArray,pVVar22->nSize,pVVar12->nSize);
              if (pVVar22->nSize < iVar10) goto LAB_00773010;
              pVVar22->nSize = iVar10;
              if (iVar10 < 7) {
                if (local_120->nSize <= iVar30) goto LAB_00772f75;
                local_120->pArray[lVar18] = *pwVar15;
              }
              else {
                uVar24 = 1 << ((byte)(iVar10 + -6) & 0x1f);
                if (local_b0->nSize <= iVar30) goto LAB_0077302f;
                local_b0->pArray[lVar18] = pVVar17->nSize;
                if (iVar10 + -6 != 0x1f) {
                  if ((int)uVar24 < 2) {
                    uVar24 = 1;
                  }
                  uVar26 = 0;
                  do {
                    Vec_WrdPush(pVVar17,pwVar15[uVar26]);
                    uVar26 = uVar26 + 1;
                  } while (uVar24 != uVar26);
                }
              }
              uVar26 = local_a8 + 1;
              vEmpty = local_e0;
              vFanins = local_d8;
            } while (uVar26 != local_a0);
          }
        }
        else {
          if (0 < (int)local_c4) {
            lVar18 = (long)(int)local_110;
            uVar26 = (ulong)local_c4;
            pVVar17 = local_120;
            do {
              if (((int)local_110 < 0) || (p->vCis->nSize <= lVar18)) goto LAB_00772ebb;
              iVar30 = p->vCis->pArray[lVar18];
              if (((long)iVar30 < 0) || (p->nObjs <= iVar30)) goto LAB_00772eda;
              if ((p->vCopies).nSize <= iVar30) goto LAB_00772ebb;
              iVar30 = (p->vCopies).pArray[iVar30];
              lVar19 = (long)iVar30;
              if ((lVar19 < 0) || (vFanins->nSize <= iVar30)) goto LAB_00772f18;
              if (vFanins->pArray[lVar19].nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xe9,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              pVVar12 = vFanins->pArray + lVar19;
              if (pVVar12->nCap < 1) {
                if (pVVar12->pArray == (int *)0x0) {
                  piVar16 = (int *)malloc(4);
                }
                else {
                  piVar16 = (int *)realloc(pVVar12->pArray,4);
                }
                pVVar12->pArray = piVar16;
                if (piVar16 == (int *)0x0) goto LAB_00772f94;
                pVVar12->nCap = 1;
                pVVar17 = local_120;
              }
              *pVVar12->pArray = iVar11;
              pVVar12->nSize = 1;
              if ((local_d0->nSize <= iVar30) ||
                 (local_d0->pArray[lVar19] = '\x01', local_e0->nSize <= iVar30)) goto LAB_00772f37;
              local_e0->pArray[lVar19] = '\x01';
              if (pVVar17->nSize <= iVar30) goto LAB_00772f75;
              pVVar17->pArray[lVar19] = wVar5;
              lVar18 = lVar18 + 1;
              iVar11 = iVar11 + 1;
              uVar26 = uVar26 - 1;
              vEmpty = local_e0;
            } while (uVar26 != 0);
          }
          pVVar17 = local_100;
          if (0 < (int)local_e8) {
            lVar18 = (long)local_140;
            iVar30 = iVar7 + iVar8 + 1 + (int)local_128;
            uVar26 = local_f8;
            do {
              if ((local_140 < 0) || (p->vCos->nSize <= lVar18)) goto LAB_00772ebb;
              iVar10 = p->vCos->pArray[lVar18];
              if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00772eda;
              if ((p->vCopies).nSize <= iVar10) goto LAB_00772ebb;
              uVar24 = iVar30 - nBbIns;
              if (((int)uVar24 < 0) || (vFanins->nSize <= (int)uVar24)) goto LAB_00772f18;
              if (vFanins->pArray[uVar24].nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xf6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              iVar10 = (p->vCopies).pArray[iVar10];
              pVVar12 = vFanins->pArray + uVar24;
              if (pVVar12->nCap < 1) {
                if (pVVar12->pArray == (int *)0x0) {
                  piVar16 = (int *)malloc(4);
                }
                else {
                  piVar16 = (int *)realloc(pVVar12->pArray,4);
                }
                pVVar12->pArray = piVar16;
                if (piVar16 == (int *)0x0) goto LAB_00772f94;
                pVVar12->nCap = 1;
              }
              *pVVar12->pArray = iVar10;
              pVVar12->nSize = 1;
              lVar18 = lVar18 + 1;
              iVar30 = iVar30 + 1;
              local_128 = (ulong)((int)local_128 + 1);
              uVar26 = uVar26 - 1;
              vEmpty = local_e0;
              pVVar17 = local_100;
              vFanins = local_d8;
            } while (uVar26 != 0);
          }
        }
        if (0 < (int)local_e8) {
          lVar18 = (long)local_140;
          uVar26 = local_f8;
          do {
            if ((local_140 < 0) || (p->vCos->nSize <= lVar18)) goto LAB_00772ebb;
            iVar30 = p->vCos->pArray[lVar18];
            if (((long)iVar30 < 0) || (p->nObjs <= iVar30)) goto LAB_00772eda;
            uVar24 = (uint)*(undefined8 *)(p->pObjs + iVar30);
            if (((undefined1  [12])(p->pObjs + iVar30)[-(ulong)(uVar24 & 0x1fffffff)] &
                (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) {
              if (p->nObjs <= iVar30) goto LAB_00772ff1;
              uVar24 = iVar30 - (uVar24 & 0x1fffffff);
              if (((int)uVar24 < 0) || ((p->vCopies).nSize <= (int)uVar24)) goto LAB_00772ebb;
              iVar30 = (p->vCopies).pArray[uVar24];
              if (((long)iVar30 < 0) || (vEmpty->nSize <= iVar30)) goto LAB_00772f37;
              vEmpty->pArray[iVar30] = '\x01';
            }
            lVar18 = lVar18 + 1;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
        }
        local_140 = local_140 + (int)local_e8;
        local_110 = CONCAT44(local_110._4_4_,(int)local_110 + local_c4);
        iVar30 = local_84 + 1;
        pTVar25 = local_b8;
      } while (iVar30 != local_c8);
    }
    Gia_ObjComputeTruthTableStop(p->pAigExtra);
    if ((int)local_110 != p->vCis->nSize) {
      __assert_fail("curCi == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x109,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (local_140 + local_ec != p->vCos->nSize) {
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if ((int)local_110 - iVar6 != p->pAigExtra->vCos->nSize) {
      __assert_fail("curCi - nRealPis == Gia_ManCoNum(p->pAigExtra)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10b,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if ((int)local_128 != nBbIns) {
      __assert_fail("iBbIn == nBbIns",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (iVar11 != nBbOuts) {
      __assert_fail("iBbOut == nBbOuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
  }
  pVVar12 = local_108;
  if (local_108->pArray != (int *)0x0) {
    free(local_108->pArray);
    pVVar12->pArray = (int *)0x0;
  }
  free(pVVar12);
  pSVar21 = Sfm_NtkConstruct(vFanins,iVar6 + nBbOuts,local_ec + nBbIns,local_d0,vEmpty,local_120,
                             local_b0,pVVar17);
  return pSVar21;
LAB_00772f18:
  __assertion = "i >= 0 && i < p->nSize";
  pcVar14 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h";
  pcVar13 = "Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)";
LAB_00772f2d:
  __assert_fail(__assertion,pcVar14,0x9c,pcVar13);
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sfm_Ntk_t * Gia_ManExtractMfs( Gia_Man_t * p )
{
    word uTruth, * pTruth, uTruths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Gia_Obj_t * pObj, * pObjExtra;
    Vec_Wec_t * vFanins; // mfs data
    Vec_Str_t * vFixed;  // mfs data 
    Vec_Str_t * vEmpty;  // mfs data
    Vec_Wrd_t * vTruths; // mfs data
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Vec_Int_t * vLeaves;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes   = Gia_ManBoxNum(p), nVars;
    int nRealPis = nBoxes ? Tim_ManPiNum(pManTime) : Gia_ManPiNum(p);
    int nRealPos = nBoxes ? Tim_ManPoNum(pManTime) : Gia_ManPoNum(p);
    int i, j, k, curCi, curCo, nBoxIns, nBoxOuts;
    int Id, iFan, nMfsVars, nBbIns = 0, nBbOuts = 0, Counter = 0;
    int nLutSizeMax = Gia_ManLutSizeMax( p );
    nLutSizeMax = Abc_MaxInt( nLutSizeMax, 6 );
    assert( nLutSizeMax < 16 );
    //assert( !p->pAigExtra || Gia_ManPiNum(p->pAigExtra) <= 6 );
    if ( pManTime ) Tim_ManBlackBoxIoNum( pManTime, &nBbIns, &nBbOuts );
    // skip PIs due to box outputs
    Counter += nBbOuts;
    // prepare storage
    nMfsVars = Gia_ManCiNum(p) + 1 + Gia_ManLutNum(p) + Gia_ManCoNum(p) + nBbIns + nBbOuts;
    vFanins  = Vec_WecStart( nMfsVars );
    vFixed   = Vec_StrStart( nMfsVars );
    vEmpty   = Vec_StrStart( nMfsVars );
    vTruths  = Vec_WrdStart( nMfsVars );
    vStarts  = Vec_IntStart( nMfsVars );
    vTruths2 = Vec_WrdAlloc( 10000 );
    // set internal PIs
    Gia_ManCleanCopyArray( p );
    Gia_ManForEachCiId( p, Id, i )
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    // set constant node
    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
    Vec_WrdWriteEntry( vTruths, Counter, (word)0 );
    Gia_ObjSetCopyArray( p, 0, Counter++ );
    // set internal LUTs
    vLeaves = Vec_IntAlloc( nLutSizeMax );
    Gia_ObjComputeTruthTableStart( p, nLutSizeMax );
    Gia_ManForEachLut( p, Id )
    {
        Vec_IntClear( vLeaves );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntGrow( vArray, Gia_ObjLutSize(p, Id) );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            assert( Gia_ObjCopyArray(p, iFan) >= 0 );
            Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
            Vec_IntPush( vLeaves, iFan );
        }
        assert( Vec_IntSize(vLeaves) < 16 );
        assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id) );
//        uTruth = *Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
//        nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
        nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
        Vec_IntShrink( vArray, nVars );
        if ( nVars <= 6 )
            Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
        else
        {
            int w, nWords = Abc_Truth6WordNum( nVars );
            Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
            for ( w = 0; w < nWords; w++ )
                Vec_WrdPush( vTruths2, pTruth[w] );
        }
        if ( Gia_ObjLutIsMux(p, Id) )
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
        }
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    }
    Gia_ObjComputeTruthTableStop( p );
    // set all POs
    Gia_ManForEachCo( p, pObj, i )
    {
        iFan = Gia_ObjFaninId0p( p, pObj );
        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntFill( vArray, 1, Gia_ObjCopyArray(p, iFan) );
        if ( i < Gia_ManCoNum(p) - nRealPos ) // internal PO
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            uTruth = Gia_ObjFaninC0(pObj) ? ~uTruths6[0]: uTruths6[0];
            Vec_WrdWriteEntry( vTruths, Counter, uTruth );
        }
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Counter++ );
    }
    // skip POs due to box inputs
    Counter += nBbIns;
    assert( Counter == nMfsVars );
    // add functions of the boxes
    if ( p->pAigExtra )
    {
        int iBbIn = 0, iBbOut = 0;
        assert( Gia_ManCiNum(p->pAigExtra) < 16 );
        Gia_ObjComputeTruthTableStart( p->pAigExtra, Gia_ManCiNum(p->pAigExtra) );
        curCi = nRealPis;
        curCo = 0;
        for ( k = 0; k < nBoxes; k++ )
        {
            nBoxIns = Tim_ManBoxInputNum( pManTime, k );
            nBoxOuts = Tim_ManBoxOutputNum( pManTime, k );
            // iterate through box outputs
            if ( !Tim_ManBoxIsBlack(pManTime, k) ) //&& Tim_ManBoxInputNum(pManTime, k) <= 6 )
            {
                // collect truth table leaves
                Vec_IntClear( vLeaves );
                for ( i = 0; i < nBoxIns; i++ )
                    Vec_IntPush( vLeaves, Gia_ObjId(p->pAigExtra, Gia_ManCi(p->pAigExtra, i)) );
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // add box inputs (POs of the AIG) as fanins
                    vArray = Vec_WecEntry( vFanins, Counter );
                    Vec_IntGrow( vArray, nBoxIns );
                    for ( i = 0; i < nBoxIns; i++ )
                    {
                        iFan = Gia_ObjId( p, Gia_ManCo(p, curCo + i) );
                        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
                        Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
                    }
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    // box output in the extra manager
                    pObjExtra = Gia_ManCo( p->pAigExtra, curCi - nRealPis + j );
                    // compute truth table
                    pTruth = NULL;
                    if ( Gia_ObjFaninId0p(p->pAigExtra, pObjExtra) == 0 )
                    {
                        uTruth = 0;
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else if ( Gia_ObjIsCi(Gia_ObjFanin0(pObjExtra)) )
                    {
                        uTruth = uTruths6[Gia_ObjCioId(Gia_ObjFanin0(pObjExtra))];
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else
                    {
                        pTruth = Gia_ObjComputeTruthTableCut( p->pAigExtra, Gia_ObjFanin0(pObjExtra), vLeaves );
                        if ( Gia_ObjFaninC0(pObjExtra) )
                            Abc_TtNot( pTruth, Abc_Truth6WordNum(Vec_IntSize(vLeaves)) );
                    }
                    //uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                    //Dau_DsdPrintFromTruth( &uTruth, Vec_IntSize(vArray) );
                    //nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
                    nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
                    Vec_IntShrink( vArray, nVars );
                    if ( nVars <= 6 )
                        Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
                    else
                    {
                        int w, nWords = Abc_Truth6WordNum( nVars );
                        Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
                        for ( w = 0; w < nWords; w++ )
                            Vec_WrdPush( vTruths2, pTruth[w] );
                    }
                }
            }
            else // create buffers for black box inputs and outputs
            {
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary input (iBbOut)
                    vArray = Vec_WecEntry( vFanins, Counter );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, iBbOut++ );
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
                    Vec_WrdWriteEntry( vTruths, Counter, uTruths6[0] );
                }
                for ( i = 0; i < nBoxIns; i++ )
                {
                    // CO corresponding to the box inputs
                    pObj = Gia_ManCo( p, curCo + i );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary output (iBbIn)
                    vArray = Vec_WecEntry( vFanins, nMfsVars - nBbIns + iBbIn++ );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, Counter );
                }
            }
            // set internal POs pointing directly to internal PIs as no-delay
            for ( i = 0; i < nBoxIns; i++ )
            {
                pObj = Gia_ManCo( p, curCo + i );
                if ( !Gia_ObjIsCi( Gia_ObjFanin0(pObj) ) )
                    continue;
                Counter = Gia_ObjCopyArray( p, Gia_ObjFaninId0p(p, pObj) );
                Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            }
            curCo += nBoxIns;
            curCi += nBoxOuts;
        }
        curCo += nRealPos;
        Gia_ObjComputeTruthTableStop( p->pAigExtra );
        // verify counts
        assert( curCi == Gia_ManCiNum(p) );
        assert( curCo == Gia_ManCoNum(p) );
        assert( curCi - nRealPis == Gia_ManCoNum(p->pAigExtra) );
        assert( iBbIn  == nBbIns );
        assert( iBbOut == nBbOuts );
    }
    // finalize 
    Vec_IntFree( vLeaves );
    return Sfm_NtkConstruct( vFanins, nBbOuts + nRealPis, nRealPos + nBbIns, vFixed, vEmpty, vTruths, vStarts, vTruths2 );
}